

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<unsigned_int>::reallocate
          (QPodArrayOps<unsigned_int> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<unsigned_int>_*,_unsigned_int_*> pVar1;
  
  pVar1 = QTypedArrayData<unsigned_int>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<unsigned_int>).d,
                     (this->super_QArrayDataPointer<unsigned_int>).ptr,alloc,option);
  (this->super_QArrayDataPointer<unsigned_int>).d = pVar1.first;
  (this->super_QArrayDataPointer<unsigned_int>).ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }